

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * llvm::outs(void)

{
  bool bVar1;
  int iVar2;
  StringRef local_38;
  undefined1 local_28 [8];
  error_code EC;
  
  std::error_code::error_code((error_code *)local_28);
  if ((outs()::S == '\0') && (iVar2 = __cxa_guard_acquire(&outs()::S), iVar2 != 0)) {
    EC._M_cat = (error_category *)0x27346c;
    strlen("-");
    raw_fd_ostream::raw_fd_ostream(&outs::S,local_38,(error_code *)local_28,F_None);
    __cxa_atexit(raw_fd_ostream::~raw_fd_ostream,&outs::S,&__dso_handle);
    __cxa_guard_release(&outs()::S);
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_28);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    return (raw_ostream *)&outs::S;
  }
  __assert_fail("!EC",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                ,0x30c,"raw_ostream &llvm::outs()");
}

Assistant:

raw_ostream &llvm::outs() {
  // Set buffer settings to model stdout behavior.
  std::error_code EC;
  static raw_fd_ostream S("-", EC, sys::fs::F_None);
  assert(!EC);
  return S;
}